

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# preprocessor.cpp
# Opt level: O2

void __thiscall mocker::RenameASTDeclarations::operator()(RenameASTDeclarations *this,ASTRoot *node)

{
  pointer psVar1;
  __shared_ptr<mocker::ast::Declaration,_(__gnu_cxx::_Lock_policy)2> *p_Var2;
  element_type *peVar3;
  pointer psVar4;
  __shared_ptr<mocker::ast::Declaration,_(__gnu_cxx::_Lock_policy)2> *__r;
  shared_ptr<mocker::ast::VarDecl> p;
  vector<std::shared_ptr<mocker::ast::VarDecl>,_std::allocator<std::shared_ptr<mocker::ast::VarDecl>_>_>
  globalVars;
  shared_ptr<mocker::ast::Declaration> local_58;
  vector<std::shared_ptr<mocker::ast::VarDecl>,_std::allocator<std::shared_ptr<mocker::ast::VarDecl>_>_>
  local_48;
  
  local_48.
  super__Vector_base<std::shared_ptr<mocker::ast::VarDecl>,_std::allocator<std::shared_ptr<mocker::ast::VarDecl>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_48.
  super__Vector_base<std::shared_ptr<mocker::ast::VarDecl>,_std::allocator<std::shared_ptr<mocker::ast::VarDecl>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_48.
  super__Vector_base<std::shared_ptr<mocker::ast::VarDecl>,_std::allocator<std::shared_ptr<mocker::ast::VarDecl>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  psVar1 = (node->decls).
           super__Vector_base<std::shared_ptr<mocker::ast::Declaration>,_std::allocator<std::shared_ptr<mocker::ast::Declaration>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  for (psVar4 = (node->decls).
                super__Vector_base<std::shared_ptr<mocker::ast::Declaration>,_std::allocator<std::shared_ptr<mocker::ast::Declaration>_>_>
                ._M_impl.super__Vector_impl_data._M_start; psVar4 != psVar1; psVar4 = psVar4 + 1) {
    std::dynamic_pointer_cast<mocker::ast::VarDecl,mocker::ast::Declaration>(&local_58);
    if ((VarDecl *)
        local_58.super___shared_ptr<mocker::ast::Declaration,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
        (VarDecl *)0x0) {
      renameGlobalVar(this,(VarDecl *)
                           local_58.
                           super___shared_ptr<mocker::ast::Declaration,_(__gnu_cxx::_Lock_policy)2>.
                           _M_ptr);
    }
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&local_58.super___shared_ptr<mocker::ast::Declaration,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount);
  }
  p_Var2 = &((node->decls).
             super__Vector_base<std::shared_ptr<mocker::ast::Declaration>,_std::allocator<std::shared_ptr<mocker::ast::Declaration>_>_>
             ._M_impl.super__Vector_impl_data._M_finish)->
            super___shared_ptr<mocker::ast::Declaration,_(__gnu_cxx::_Lock_policy)2>;
  for (__r = &((node->decls).
               super__Vector_base<std::shared_ptr<mocker::ast::Declaration>,_std::allocator<std::shared_ptr<mocker::ast::Declaration>_>_>
               ._M_impl.super__Vector_impl_data._M_start)->
              super___shared_ptr<mocker::ast::Declaration,_(__gnu_cxx::_Lock_policy)2>;
      __r != p_Var2; __r = __r + 1) {
    std::dynamic_pointer_cast<mocker::ast::VarDecl,mocker::ast::Declaration>(&local_58);
    peVar3 = local_58.super___shared_ptr<mocker::ast::Declaration,_(__gnu_cxx::_Lock_policy)2>.
             _M_ptr;
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&local_58.super___shared_ptr<mocker::ast::Declaration,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount);
    if ((VarDecl *)peVar3 == (VarDecl *)0x0) {
      std::__shared_ptr<mocker::ast::ASTNode,(__gnu_cxx::_Lock_policy)2>::
      __shared_ptr<mocker::ast::Declaration,void>
                ((__shared_ptr<mocker::ast::ASTNode,(__gnu_cxx::_Lock_policy)2> *)&local_58,__r);
      (*(((Declaration *)
         &(local_58.super___shared_ptr<mocker::ast::Declaration,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
          ->super_ASTNode)->super_ASTNode)._vptr_ASTNode[2])
                (local_58.super___shared_ptr<mocker::ast::Declaration,_(__gnu_cxx::_Lock_policy)2>.
                 _M_ptr,this);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                (&local_58.super___shared_ptr<mocker::ast::Declaration,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount);
    }
  }
  std::
  vector<std::shared_ptr<mocker::ast::VarDecl>,_std::allocator<std::shared_ptr<mocker::ast::VarDecl>_>_>
  ::~vector(&local_48);
  return;
}

Assistant:

void operator()(ast::ASTRoot &node) const override {
    std::vector<std::shared_ptr<ast::VarDecl>> globalVars;
    for (auto &decl : node.decls)
      if (auto p = std::dynamic_pointer_cast<ast::VarDecl>(decl))
        renameGlobalVar(*p);

    for (auto &decl : node.decls) {
      if (std::dynamic_pointer_cast<ast::VarDecl>(decl))
        continue;
      visit(decl);
    }
  }